

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_sop_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  jpc_sop_t *sop;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
  if (iVar1 == 0) {
    ms_local._4_4_ = 0;
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_sop_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_sop_t *sop = &ms->parms.sop;

	/* Eliminate compiler warning about unused variable. */
	(void)cstate;

	if (jpc_getuint16(in, &sop->seqno)) {
		return -1;
	}
	return 0;
}